

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

int __thiscall QObject::startTimer(QObject *this,milliseconds time,TimerType timerType)

{
  bool bVar1;
  int iVar2;
  undefined4 in_EDX;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  rep r;
  nanoseconds in_stack_00000068;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  QMessageLogger *this_00;
  duration<long,std::ratio<1l,1000000000l>> local_48 [8];
  duration<long,_std::ratio<1L,_1000000000L>_> local_40 [2];
  TimerType in_stack_ffffffffffffffd4;
  QObject *in_stack_ffffffffffffffd8;
  undefined1 *local_18;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
  bVar1 = qMulOverflow<1000000L,_long>
                    ((long)in_RDI,
                     (long *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (this_00,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffa8),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QMessageLogger::warning
              ((QMessageLogger *)(local_40 + 1),
               "QObject::startTimer(std::chrono::milliseconds): \'time\' arg overflowed when converted to nanoseconds."
              );
    local_40[0] = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
    local_18 = (undefined1 *)
               std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_40);
  }
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            (local_48,(long *)&local_18);
  iVar2 = startTimer(in_stack_ffffffffffffffd8,in_stack_00000068,in_stack_ffffffffffffffd4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QObject::startTimer(std::chrono::milliseconds time, Qt::TimerType timerType)
{
    using namespace std::chrono;
    using ratio = std::ratio_divide<std::milli, std::nano>;
    nanoseconds::rep r;
    if (qMulOverflow<ratio::num>(time.count(), &r)) {
        qWarning("QObject::startTimer(std::chrono::milliseconds): "
                 "'time' arg overflowed when converted to nanoseconds.");
        r = nanoseconds::max().count();
    }
    return startTimer(nanoseconds{r}, timerType);
}